

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  EVP_PKEY_CTX *in_RDX;
  byte bVar1;
  anon_union_24_2_13149d16_for_String_3 local_30;
  
  bVar1 = (byte)this[5] ^ (byte)*this;
  if (((bVar1 & 1) == 0) || (*(char *)(g_cs + 0x6c) == '\x01')) {
    doctest::toString((String *)&local_30.data,(bool)*this);
    Result::Result(__return_storage_ptr__,(bool)(bVar1 & 1),(String *)&local_30.data);
  }
  else {
    local_30.buf[0] = '\0';
    local_30.buf[0x17] = '\x17';
    __return_storage_ptr__->m_passed = true;
    String::copy(&__return_storage_ptr__->m_decomp,(EVP_PKEY_CTX *)&local_30.data,in_RDX);
  }
  String::~String((String *)&local_30.data);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) { //!OCLINT bitwise operator in conditional
                res = !res;
            }

            if(!res || getContextOptions()->success) {
                return { res, (DOCTEST_STRINGIFY(lhs)) };
            }
            return { res };
        }